

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O0

void ImpactGenerator_AddImpact(int index,float volume,float decay,float cut,float bw)

{
  undefined1 local_40 [8];
  Impact imp;
  ImpactInstance *instance;
  float bw_local;
  float cut_local;
  float decay_local;
  float volume_local;
  int index_local;
  
  imp._16_8_ = ImpactGenerator::GetImpactInstance(index);
  if (((ImpactInstance *)imp._16_8_ != (ImpactInstance *)0x0) &&
     (((ImpactInstance *)imp._16_8_)->numimpacts < ((ImpactInstance *)imp._16_8_)->maximpacts)) {
    imp.volume = 0.0;
    imp.decay = 0.0;
    local_40._0_4_ = volume;
    local_40._4_4_ = decay;
    imp.lpf = cut;
    imp.bpf = bw;
    RingBuffer<1000,_ImpactGenerator::Impact>::Feed
              (&((ImpactInstance *)imp._16_8_)->impactrb,(Impact *)local_40);
  }
  return;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API void ImpactGenerator_AddImpact(int index, float volume, float decay, float cut, float bw)
    {
        ImpactInstance* instance = GetImpactInstance(index);
        if (instance == NULL)
            return;
        if (instance->numimpacts >= instance->maximpacts)
            return;
        Impact imp;
        imp.volume = volume;
        imp.decay = decay;
        imp.cut = cut;
        imp.bw = bw;
        imp.lpf = 0.0f;
        imp.bpf = 0.0f;
        instance->impactrb.Feed(imp);
    }